

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

void select_none_cb(Fl_Widget *param_1,void *param_2)

{
  bool bVar1;
  bool bVar2;
  fd_set *in_R8;
  timeval *in_R9;
  Fl_Type *local_48;
  Fl_Type *local_40;
  Fl_Type *t_2;
  Fl_Type *t_1;
  Fl_Type *pFStack_28;
  int foundany;
  Fl_Type *t;
  Fl_Type *p;
  void *param_1_local;
  Fl_Widget *param_0_local;
  
  if (Fl_Type::current == (Fl_Type *)0x0) {
    local_48 = (Fl_Type *)0x0;
  }
  else {
    local_48 = Fl_Type::current->parent;
  }
  t = local_48;
  if (in_this_only != (Fl_Type *)0x0) {
    for (pFStack_28 = local_48; pFStack_28 != (Fl_Type *)0x0 && pFStack_28 != in_this_only;
        pFStack_28 = pFStack_28->parent) {
    }
    if (pFStack_28 != in_this_only) {
      t = in_this_only;
    }
  }
  for (; t != (Fl_Type *)0x0; t = t->parent) {
    bVar2 = false;
    t_2 = t->next;
    while( true ) {
      bVar1 = false;
      if (t_2 != (Fl_Type *)0x0) {
        bVar1 = t->level < t_2->level;
      }
      if (!bVar1) break;
      if (t_2->new_selected != '\0') {
        Fl_Browser_::select(&widget_browser->super_Fl_Browser_,(int)t_2,(fd_set *)0x0,(fd_set *)0x0,
                            in_R8,in_R9);
        bVar2 = true;
      }
      t_2 = t_2->next;
    }
    if (bVar2) goto LAB_00195f32;
  }
  for (local_40 = Fl_Type::first; local_40 != (Fl_Type *)0x0; local_40 = local_40->next) {
    Fl_Browser_::select(&widget_browser->super_Fl_Browser_,(int)local_40,(fd_set *)0x0,(fd_set *)0x0
                        ,in_R8,in_R9);
  }
LAB_00195f32:
  selection_changed(t);
  return;
}

Assistant:

void select_none_cb(Fl_Widget *,void *) {
  Fl_Type *p = Fl_Type::current ? Fl_Type::current->parent : 0;
  if (in_this_only) {
    Fl_Type *t = p;
    for (; t && t != in_this_only; t = t->parent) {/*empty*/}
    if (t != in_this_only) p = in_this_only;
  }
  for (;;) {
    if (p) {
      int foundany = 0;
      for (Fl_Type *t = p->next; t && t->level>p->level; t = t->next) {
	if (t->new_selected) {widget_browser->select(t,0,0); foundany = 1;}
      }
      if (foundany) break;
      p = p->parent;
    } else {
      for (Fl_Type *t = Fl_Type::first; t; t = t->next)
	widget_browser->select(t,0,0);
      break;
    }
  }
  selection_changed(p);
}